

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrpParser.cpp
# Opt level: O1

void __thiscall GrpParser::languageSpecItem(GrpParser *this)

{
  RefAST *this_00;
  ASTFactory *pAVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  int *piVar5;
  undefined8 *puVar6;
  AST *pAVar7;
  RefAST RVar8;
  NoViableAltException *pNVar9;
  AST *pAVar10;
  RefCount<Token> *this_01;
  RefAST tmp171_AST;
  RefAST languageSpecItem_AST;
  ASTPair currentAST;
  RefAST E2_AST;
  RefAST E1_AST;
  RefAST LL_AST;
  RefAST Ilangs_AST;
  RefAST Ilang_AST;
  RefAST Vi2_AST;
  RefAST Vi1_AST;
  RefAST I_AST;
  RefToken E2;
  RefToken Ilangs;
  RefToken Ilang;
  RefToken Vi2;
  RefToken E1;
  RefToken I;
  ASTFactory local_170;
  RefCount<AST> local_160;
  ASTPair local_158;
  RefCount<AST> local_140;
  RefCount<AST> local_138;
  RefCount<AST> local_130;
  RefCount<AST> local_128;
  RefCount<AST> local_120;
  RefCount<AST> local_118;
  RefCount<AST> local_110;
  RefCount<AST> local_108;
  RefCount<Token> local_100;
  ASTFactory local_f8;
  RefCount<Token> local_e8;
  RefCount<Token> local_e0;
  RefCount<Token> local_d8;
  RefCount<Token> local_d0;
  RefCount<Token> local_c8;
  RefToken local_c0;
  RefToken local_b8;
  RefCount<AST> local_b0;
  RefCount<AST> local_a8;
  RefCount<AST> local_a0;
  RefCount<AST> local_98;
  RefCount<Token> local_90;
  RefToken local_88;
  RefCount<Token> local_80;
  RefCount<Token> local_78;
  RefCount<AST> local_70;
  RefCount<AST> local_68;
  RefCount<AST> local_60;
  RefCount<AST> local_58;
  RefToken local_50;
  RefCount<Token> local_48;
  RefCount<Token> local_40;
  RefCount<Token> local_38;
  
  this_00 = &(this->super_LLkParser).super_Parser.returnAST;
  RefCount<AST>::operator=(this_00,&nullAST);
  local_140.ref = nullAST.ref;
  local_158.root.ref = (Ref *)0x0;
  local_158.child.ref = (Ref *)0x0;
  if (nullAST.ref == (Ref *)0x0) {
    local_170.nodeFactory = (factory_type)0x0;
  }
  else {
    (nullAST.ref)->count = (nullAST.ref)->count + 1;
    local_170.nodeFactory = (factory_type)local_140.ref;
  }
  local_f8.nodeFactory = (factory_type)nullToken.ref;
  if (nullToken.ref == (Ref *)0x0) {
    local_c8.ref = (Ref *)0x0;
  }
  else {
    (nullToken.ref)->count = (nullToken.ref)->count + 1;
    local_c8.ref = (Ref *)local_f8.nodeFactory;
  }
  if (local_140.ref == (Ref *)0x0) {
    local_108.ref = (Ref *)0x0;
  }
  else {
    (local_140.ref)->count = (local_140.ref)->count + 1;
    local_108.ref = local_140.ref;
  }
  if ((Ref *)local_f8.nodeFactory == (Ref *)0x0) {
    local_d0.ref = (Ref *)0x0;
  }
  else {
    ((Ref *)local_f8.nodeFactory)->count = ((Ref *)local_f8.nodeFactory)->count + 1;
    local_d0.ref = (Ref *)local_f8.nodeFactory;
  }
  if (local_140.ref == (Ref *)0x0) {
    local_138.ref = (Ref *)0x0;
  }
  else {
    uVar2 = (local_140.ref)->count;
    (local_140.ref)->count = uVar2 + 1;
    local_138.ref = local_140.ref;
    (local_140.ref)->count = uVar2 + 2;
  }
  if ((Ref *)local_f8.nodeFactory == (Ref *)0x0) {
    local_d8.ref = (Ref *)0x0;
  }
  else {
    ((Ref *)local_f8.nodeFactory)->count = ((Ref *)local_f8.nodeFactory)->count + 1;
    local_d8.ref = (Ref *)local_f8.nodeFactory;
  }
  if (local_140.ref == (Ref *)0x0) {
    local_118.ref = (Ref *)0x0;
  }
  else {
    (local_140.ref)->count = (local_140.ref)->count + 1;
    local_118.ref = local_140.ref;
  }
  if ((Ref *)local_f8.nodeFactory == (Ref *)0x0) {
    local_e0.ref = (Ref *)0x0;
  }
  else {
    ((Ref *)local_f8.nodeFactory)->count = ((Ref *)local_f8.nodeFactory)->count + 1;
    local_e0.ref = (Ref *)local_f8.nodeFactory;
  }
  if (local_140.ref == (Ref *)0x0) {
    local_120.ref = (Ref *)0x0;
  }
  else {
    (local_140.ref)->count = (local_140.ref)->count + 1;
    local_120.ref = local_140.ref;
  }
  if ((Ref *)local_f8.nodeFactory == (Ref *)0x0) {
    local_e8.ref = (Ref *)0x0;
  }
  else {
    ((Ref *)local_f8.nodeFactory)->count = ((Ref *)local_f8.nodeFactory)->count + 1;
    local_e8.ref = (Ref *)local_f8.nodeFactory;
  }
  if (local_140.ref == (Ref *)0x0) {
    local_128.ref = (Ref *)0x0;
  }
  else {
    (local_140.ref)->count = (local_140.ref)->count + 1;
    local_128.ref = local_140.ref;
  }
  if ((Ref *)local_f8.nodeFactory == (Ref *)0x0) {
    local_f8.nodeFactory = (factory_type)0x0;
  }
  else {
    ((Ref *)local_f8.nodeFactory)->count = ((Ref *)local_f8.nodeFactory)->count + 1;
  }
  if (local_140.ref == (Ref *)0x0) {
    local_140.ref = (Ref *)0x0;
  }
  else {
    uVar2 = (local_140.ref)->count;
    (local_140.ref)->count = uVar2 + 1;
    (local_140.ref)->count = uVar2 + 2;
  }
  local_130.ref = local_140.ref;
  local_110.ref = local_138.ref;
  iVar4 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
  if (iVar4 - 0x23U < 2) {
    iVar4 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
    if (iVar4 == 0x24) {
      (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_170,this,1);
      RefCount<Token>::operator=(&local_e8,(RefCount<Token> *)&local_170);
      RefCount<Token>::~RefCount((RefCount<Token> *)&local_170);
      if (local_e8.ref == (Ref *)0x0) {
        local_80.ref = (Ref *)0x0;
      }
      else {
        (local_e8.ref)->count = (local_e8.ref)->count + 1;
        local_80.ref = local_e8.ref;
      }
      ASTFactory::create(&local_170,(RefToken *)&(this->super_LLkParser).super_Parser.astFactory);
      RefCount<AST>::operator=(&local_128,(RefCount<AST> *)&local_170);
      RefCount<AST>::~RefCount((RefCount<AST> *)&local_170);
      this_01 = &local_80;
    }
    else {
      if (iVar4 != 0x23) {
        pNVar9 = (NoViableAltException *)__cxa_allocate_exception(0x40);
        (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_88,this,1);
        NoViableAltException::NoViableAltException(pNVar9,&local_88);
        __cxa_throw(pNVar9,&NoViableAltException::typeinfo,
                    NoViableAltException::~NoViableAltException);
      }
      (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_170,this,1);
      RefCount<Token>::operator=(&local_e0,(RefCount<Token> *)&local_170);
      RefCount<Token>::~RefCount((RefCount<Token> *)&local_170);
      if (local_e0.ref == (Ref *)0x0) {
        local_78.ref = (Ref *)0x0;
      }
      else {
        (local_e0.ref)->count = (local_e0.ref)->count + 1;
        local_78.ref = local_e0.ref;
      }
      ASTFactory::create(&local_170,(RefToken *)&(this->super_LLkParser).super_Parser.astFactory);
      RefCount<AST>::operator=(&local_120,(RefCount<AST> *)&local_170);
      RefCount<AST>::~RefCount((RefCount<AST> *)&local_170);
      this_01 = &local_78;
    }
    RefCount<Token>::~RefCount(this_01);
    Parser::match((Parser *)this,iVar4);
    (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_170,this,1);
    RefCount<Token>::operator=
              ((RefCount<Token> *)&local_f8.nodeFactory,(RefCount<Token> *)&local_170);
    RefCount<Token>::~RefCount((RefCount<Token> *)&local_170);
    pAVar1 = &(this->super_LLkParser).super_Parser.astFactory;
    if ((Ref *)local_f8.nodeFactory == (Ref *)0x0) {
      local_90.ref = (Ref *)0x0;
    }
    else {
      *(uint *)((long)local_f8.nodeFactory + 8) = *(uint *)((long)local_f8.nodeFactory + 8) + 1;
      local_90.ref = (Ref *)local_f8.nodeFactory;
    }
    ASTFactory::create(&local_170,(RefToken *)pAVar1);
    RefCount<AST>::operator=(&local_140,(RefCount<AST> *)&local_170);
    RefCount<AST>::~RefCount((RefCount<AST> *)&local_170);
    RefCount<Token>::~RefCount(&local_90);
    Parser::match((Parser *)this,4);
    languageCodeList(this);
    RefCount<AST>::operator=(&local_130,this_00);
    RefCount<AST>::operator=((RefCount<AST> *)&local_170.nodeFactory,&local_158.root);
    piVar5 = (int *)operator_new(0x20);
    *piVar5 = 0;
    piVar5[2] = 0;
    piVar5[3] = 0;
    piVar5[4] = 0;
    piVar5[5] = 0;
    piVar5[6] = 0;
    piVar5[7] = 0;
    puVar6 = (undefined8 *)operator_new(0x20);
    *(undefined8 **)(piVar5 + 2) = puVar6;
    *(undefined8 **)(piVar5 + 4) = puVar6;
    *(undefined8 **)(piVar5 + 6) = puVar6 + 4;
    puVar6[2] = 0;
    puVar6[3] = 0;
    *puVar6 = 0;
    puVar6[1] = 0;
    *(undefined8 **)(piVar5 + 4) = puVar6 + 4;
    if (local_140.ref == (Ref *)0x0) {
      local_98.ref = (Ref *)0x0;
    }
    else {
      (local_140.ref)->count = (local_140.ref)->count + 1;
      local_98.ref = local_140.ref;
    }
    iVar4 = *piVar5;
    *piVar5 = iVar4 + 1;
    RefCount<AST>::operator=((RefCount<AST> *)(puVar6 + iVar4),&local_98);
    if (local_120.ref == (Ref *)0x0) {
      local_a0.ref = (Ref *)0x0;
    }
    else {
      (local_120.ref)->count = (local_120.ref)->count + 1;
      local_a0.ref = local_120.ref;
    }
    iVar4 = *piVar5;
    *piVar5 = iVar4 + 1;
    RefCount<AST>::operator=((RefCount<AST> *)((long)iVar4 * 8 + *(long *)(piVar5 + 2)),&local_a0);
    if (local_128.ref == (Ref *)0x0) {
      local_a8.ref = (Ref *)0x0;
    }
    else {
      (local_128.ref)->count = (local_128.ref)->count + 1;
      local_a8.ref = local_128.ref;
    }
    iVar4 = *piVar5;
    *piVar5 = iVar4 + 1;
    RefCount<AST>::operator=((RefCount<AST> *)((long)iVar4 * 8 + *(long *)(piVar5 + 2)),&local_a8);
    if (local_130.ref == (Ref *)0x0) {
      local_b0.ref = (Ref *)0x0;
    }
    else {
      (local_130.ref)->count = (local_130.ref)->count + 1;
      local_b0.ref = local_130.ref;
    }
    iVar4 = *piVar5;
    *piVar5 = iVar4 + 1;
    RefCount<AST>::operator=((RefCount<AST> *)((long)iVar4 * 8 + *(long *)(piVar5 + 2)),&local_b0);
    ASTFactory::make(&local_170,(ASTArray *)pAVar1);
    RefCount<AST>::operator=((RefCount<AST> *)&local_170.nodeFactory,(RefCount<AST> *)&local_170);
    RefCount<AST>::~RefCount((RefCount<AST> *)&local_170);
    RefCount<AST>::~RefCount(&local_b0);
    RefCount<AST>::~RefCount(&local_a8);
    RefCount<AST>::~RefCount(&local_a0);
    RefCount<AST>::~RefCount(&local_98);
    RefCount<AST>::operator=(&local_158.root,(RefCount<AST> *)&local_170.nodeFactory);
    if ((Ref *)local_170.nodeFactory == (Ref *)0x0) {
      pAVar7 = (AST *)0x0;
    }
    else {
      pAVar7 = *(AST **)local_170.nodeFactory;
    }
    if (nullAST.ref == (Ref *)0x0) {
      pAVar10 = (AST *)0x0;
    }
    else {
      pAVar10 = (nullAST.ref)->ptr;
    }
    bVar3 = pAVar7 != pAVar10;
    if (pAVar7 == pAVar10) {
LAB_001a2f23:
      if ((Ref *)local_170.nodeFactory == (Ref *)0x0) {
        local_170._vptr_ASTFactory = (_func_int **)0x0;
      }
      else {
        *(uint *)((long)local_170.nodeFactory + 8) = *(uint *)((long)local_170.nodeFactory + 8) + 1;
        local_170._vptr_ASTFactory = (_func_int **)local_170.nodeFactory;
      }
    }
    else {
      AST::getFirstChild(*(AST **)local_170.nodeFactory);
      if (local_160.ref == (Ref *)0x0) {
        pAVar7 = (AST *)0x0;
      }
      else {
        pAVar7 = (local_160.ref)->ptr;
      }
      if (nullAST.ref == (Ref *)0x0) {
        pAVar10 = (AST *)0x0;
      }
      else {
        pAVar10 = (nullAST.ref)->ptr;
      }
      if (pAVar7 == pAVar10) goto LAB_001a2f23;
      bVar3 = true;
      AST::getFirstChild(*(AST **)local_170.nodeFactory);
    }
    RefCount<AST>::operator=(&local_158.child,(RefCount<AST> *)&local_170);
  }
  else {
    if (iVar4 != 0xd) {
      pNVar9 = (NoViableAltException *)__cxa_allocate_exception(0x40);
      (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_b8,this,1);
      NoViableAltException::NoViableAltException(pNVar9,&local_b8);
      __cxa_throw(pNVar9,&NoViableAltException::typeinfo,NoViableAltException::~NoViableAltException
                 );
    }
    (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_170,this,1);
    RefCount<Token>::operator=(&local_c8,(RefCount<Token> *)&local_170);
    RefCount<Token>::~RefCount((RefCount<Token> *)&local_170);
    pAVar1 = &(this->super_LLkParser).super_Parser.astFactory;
    if (local_c8.ref == (Ref *)0x0) {
      local_38.ref = (Ref *)0x0;
    }
    else {
      (local_c8.ref)->count = (local_c8.ref)->count + 1;
      local_38.ref = local_c8.ref;
    }
    ASTFactory::create(&local_170,(RefToken *)pAVar1);
    RefCount<AST>::operator=(&local_108,(RefCount<AST> *)&local_170);
    RefCount<AST>::~RefCount((RefCount<AST> *)&local_170);
    RefCount<Token>::~RefCount(&local_38);
    Parser::match((Parser *)this,0xd);
    (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_170,this,1);
    RefCount<Token>::operator=(&local_d0,(RefCount<Token> *)&local_170);
    RefCount<Token>::~RefCount((RefCount<Token> *)&local_170);
    if (local_d0.ref == (Ref *)0x0) {
      local_40.ref = (Ref *)0x0;
    }
    else {
      (local_d0.ref)->count = (local_d0.ref)->count + 1;
      local_40.ref = local_d0.ref;
    }
    ASTFactory::create(&local_170,(RefToken *)pAVar1);
    RefCount<AST>::operator=(&local_138,(RefCount<AST> *)&local_170);
    RefCount<AST>::~RefCount((RefCount<AST> *)&local_170);
    RefCount<Token>::~RefCount(&local_40);
    Parser::match((Parser *)this,4);
    iVar4 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
    if (iVar4 < 0x50) {
      if (iVar4 - 0x4bU < 2) goto LAB_001a301e;
      if (iVar4 != 0xd) {
        if (iVar4 != 0x11) goto LAB_001a2fc3;
        goto LAB_001a301e;
      }
      (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_170,this,1);
      RefCount<Token>::operator=(&local_d8,(RefCount<Token> *)&local_170);
      RefCount<Token>::~RefCount((RefCount<Token> *)&local_170);
      if (local_d8.ref == (Ref *)0x0) {
        local_48.ref = (Ref *)0x0;
      }
      else {
        (local_d8.ref)->count = (local_d8.ref)->count + 1;
        local_48.ref = local_d8.ref;
      }
      ASTFactory::create(&local_170,(RefToken *)pAVar1);
      RefCount<AST>::operator=(&local_118,(RefCount<AST> *)&local_170);
      RefCount<AST>::~RefCount((RefCount<AST> *)&local_170);
      RefCount<Token>::~RefCount(&local_48);
      Parser::match((Parser *)this,0xd);
    }
    else {
      if (1 < iVar4 - 0x50U) {
LAB_001a2fc3:
        pNVar9 = (NoViableAltException *)__cxa_allocate_exception(0x40);
        (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_50,this,1);
        NoViableAltException::NoViableAltException(pNVar9,&local_50);
        __cxa_throw(pNVar9,&NoViableAltException::typeinfo,
                    NoViableAltException::~NoViableAltException);
      }
LAB_001a301e:
      signedInt(this);
      RefCount<AST>::operator=(&local_110,this_00);
    }
    RefCount<AST>::operator=((RefCount<AST> *)&local_170.nodeFactory,&local_158.root);
    piVar5 = (int *)operator_new(0x20);
    *piVar5 = 0;
    piVar5[2] = 0;
    piVar5[3] = 0;
    piVar5[4] = 0;
    piVar5[5] = 0;
    piVar5[6] = 0;
    piVar5[7] = 0;
    puVar6 = (undefined8 *)operator_new(0x20);
    *(undefined8 **)(piVar5 + 2) = puVar6;
    *(undefined8 **)(piVar5 + 4) = puVar6;
    *(undefined8 **)(piVar5 + 6) = puVar6 + 4;
    puVar6[2] = 0;
    puVar6[3] = 0;
    *puVar6 = 0;
    puVar6[1] = 0;
    *(undefined8 **)(piVar5 + 4) = puVar6 + 4;
    if (local_138.ref == (Ref *)0x0) {
      local_58.ref = (Ref *)0x0;
    }
    else {
      (local_138.ref)->count = (local_138.ref)->count + 1;
      local_58.ref = local_138.ref;
    }
    iVar4 = *piVar5;
    *piVar5 = iVar4 + 1;
    RefCount<AST>::operator=((RefCount<AST> *)(puVar6 + iVar4),&local_58);
    if (local_108.ref == (Ref *)0x0) {
      local_60.ref = (Ref *)0x0;
    }
    else {
      (local_108.ref)->count = (local_108.ref)->count + 1;
      local_60.ref = local_108.ref;
    }
    iVar4 = *piVar5;
    *piVar5 = iVar4 + 1;
    RefCount<AST>::operator=((RefCount<AST> *)((long)iVar4 * 8 + *(long *)(piVar5 + 2)),&local_60);
    if (local_110.ref == (Ref *)0x0) {
      local_68.ref = (Ref *)0x0;
    }
    else {
      (local_110.ref)->count = (local_110.ref)->count + 1;
      local_68.ref = local_110.ref;
    }
    iVar4 = *piVar5;
    *piVar5 = iVar4 + 1;
    RefCount<AST>::operator=((RefCount<AST> *)((long)iVar4 * 8 + *(long *)(piVar5 + 2)),&local_68);
    if (local_118.ref == (Ref *)0x0) {
      local_70.ref = (Ref *)0x0;
    }
    else {
      (local_118.ref)->count = (local_118.ref)->count + 1;
      local_70.ref = local_118.ref;
    }
    iVar4 = *piVar5;
    *piVar5 = iVar4 + 1;
    RefCount<AST>::operator=((RefCount<AST> *)((long)iVar4 * 8 + *(long *)(piVar5 + 2)),&local_70);
    ASTFactory::make(&local_170,(ASTArray *)pAVar1);
    RefCount<AST>::operator=((RefCount<AST> *)&local_170.nodeFactory,(RefCount<AST> *)&local_170);
    RefCount<AST>::~RefCount((RefCount<AST> *)&local_170);
    RefCount<AST>::~RefCount(&local_70);
    RefCount<AST>::~RefCount(&local_68);
    RefCount<AST>::~RefCount(&local_60);
    RefCount<AST>::~RefCount(&local_58);
    RefCount<AST>::operator=(&local_158.root,(RefCount<AST> *)&local_170.nodeFactory);
    if ((Ref *)local_170.nodeFactory == (Ref *)0x0) {
      pAVar7 = (AST *)0x0;
    }
    else {
      pAVar7 = *(AST **)local_170.nodeFactory;
    }
    if (nullAST.ref == (Ref *)0x0) {
      pAVar10 = (AST *)0x0;
    }
    else {
      pAVar10 = (nullAST.ref)->ptr;
    }
    bVar3 = pAVar7 != pAVar10;
    if (pAVar7 == pAVar10) {
LAB_001a3236:
      if ((Ref *)local_170.nodeFactory == (Ref *)0x0) {
        local_170._vptr_ASTFactory = (_func_int **)0x0;
      }
      else {
        *(uint *)((long)local_170.nodeFactory + 8) = *(uint *)((long)local_170.nodeFactory + 8) + 1;
        local_170._vptr_ASTFactory = (_func_int **)local_170.nodeFactory;
      }
    }
    else {
      AST::getFirstChild(*(AST **)local_170.nodeFactory);
      if (local_160.ref == (Ref *)0x0) {
        pAVar7 = (AST *)0x0;
      }
      else {
        pAVar7 = (local_160.ref)->ptr;
      }
      if (nullAST.ref == (Ref *)0x0) {
        pAVar10 = (AST *)0x0;
      }
      else {
        pAVar10 = (nullAST.ref)->ptr;
      }
      if (pAVar7 == pAVar10) goto LAB_001a3236;
      bVar3 = true;
      AST::getFirstChild(*(AST **)local_170.nodeFactory);
    }
    RefCount<AST>::operator=(&local_158.child,(RefCount<AST> *)&local_170);
  }
  RefCount<AST>::~RefCount((RefCount<AST> *)&local_170);
  if (bVar3) {
    RefCount<AST>::~RefCount(&local_160);
  }
  ASTPair::advanceChildToEnd(&local_158);
  iVar4 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
  if (iVar4 == 8) {
    iVar4 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,2);
    bVar3 = BitSet::member(&_tokenSet_45,iVar4);
    if (bVar3) {
      iVar4 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,3);
      bVar3 = BitSet::member(&_tokenSet_4,iVar4);
      RVar8 = nullAST;
      if (bVar3) {
        if (nullAST.ref == (Ref *)0x0) {
          RVar8.ref = (Ref *)0x0;
        }
        else {
          (nullAST.ref)->count = (nullAST.ref)->count + 1;
        }
        local_170._vptr_ASTFactory = (_func_int **)RVar8.ref;
        (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_100,this,1);
        ASTFactory::create(&local_f8,(RefToken *)&(this->super_LLkParser).super_Parser.astFactory);
        RefCount<AST>::operator=((RefCount<AST> *)&local_170,(RefCount<AST> *)&local_f8);
        RefCount<AST>::~RefCount((RefCount<AST> *)&local_f8);
        RefCount<Token>::~RefCount(&local_100);
        Parser::match((Parser *)this,8);
        RefCount<AST>::~RefCount((RefCount<AST> *)&local_170);
        goto LAB_001a3351;
      }
    }
  }
  iVar4 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
  bVar3 = BitSet::member(&_tokenSet_45,iVar4);
  if (bVar3) {
    iVar4 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,2);
    bVar3 = BitSet::member(&_tokenSet_4,iVar4);
    if (bVar3) {
      iVar4 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,3);
      bVar3 = BitSet::member(&_tokenSet_4,iVar4);
      if (bVar3) {
LAB_001a3351:
        RefCount<AST>::operator=(this_00,(RefCount<AST> *)&local_170.nodeFactory);
        RefCount<AST>::~RefCount(&local_130);
        RefCount<AST>::~RefCount(&local_140);
        RefCount<Token>::~RefCount((RefCount<Token> *)&local_f8.nodeFactory);
        RefCount<AST>::~RefCount(&local_128);
        RefCount<Token>::~RefCount(&local_e8);
        RefCount<AST>::~RefCount(&local_120);
        RefCount<Token>::~RefCount(&local_e0);
        RefCount<AST>::~RefCount(&local_118);
        RefCount<Token>::~RefCount(&local_d8);
        RefCount<AST>::~RefCount(&local_110);
        RefCount<AST>::~RefCount(&local_138);
        RefCount<Token>::~RefCount(&local_d0);
        RefCount<AST>::~RefCount(&local_108);
        RefCount<Token>::~RefCount(&local_c8);
        RefCount<AST>::~RefCount((RefCount<AST> *)&local_170.nodeFactory);
        RefCount<AST>::~RefCount(&local_158.child);
        RefCount<AST>::~RefCount(&local_158.root);
        return;
      }
    }
  }
  pNVar9 = (NoViableAltException *)__cxa_allocate_exception(0x40);
  (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_c0,this,1);
  NoViableAltException::NoViableAltException(pNVar9,&local_c0);
  __cxa_throw(pNVar9,&NoViableAltException::typeinfo,NoViableAltException::~NoViableAltException);
}

Assistant:

void GrpParser::languageSpecItem() {
	
	returnAST = nullAST;
	ASTPair currentAST;
	RefAST languageSpecItem_AST = nullAST;
	RefToken  I = nullToken;
	RefAST I_AST = nullAST;
	RefToken  E1 = nullToken;
	RefAST E1_AST = nullAST;
	RefAST Vi1_AST = nullAST;
	RefToken  Vi2 = nullToken;
	RefAST Vi2_AST = nullAST;
	RefToken  Ilang = nullToken;
	RefAST Ilang_AST = nullAST;
	RefToken  Ilangs = nullToken;
	RefAST Ilangs_AST = nullAST;
	RefToken  E2 = nullToken;
	RefAST E2_AST = nullAST;
	RefAST LL_AST = nullAST;
	
	try {      // for error handling
		{
		switch ( LA(1)) {
		case IDENT:
		{
			I = LT(1);
			I_AST = astFactory.create(I);
			match(IDENT);
			E1 = LT(1);
			E1_AST = astFactory.create(E1);
			match(OP_EQ);
			{
			switch ( LA(1)) {
			case LIT_INT:
			case OP_PLUS:
			case OP_MINUS:
			case LITERAL_true:
			case LITERAL_false:
			{
				signedInt();
				Vi1_AST = returnAST;
				break;
			}
			case IDENT:
			{
				Vi2 = LT(1);
				Vi2_AST = astFactory.create(Vi2);
				match(IDENT);
				break;
			}
			default:
			{
				throw NoViableAltException(LT(1));
			}
			}
			}
			languageSpecItem_AST = currentAST.root;
			languageSpecItem_AST = astFactory.make( (new ASTArray(4))->add(E1_AST)->add(I_AST)->add(Vi1_AST)->add(Vi2_AST));
			currentAST.root = languageSpecItem_AST;
			currentAST.child = languageSpecItem_AST!=nullAST &&languageSpecItem_AST->getFirstChild()!=nullAST ?
				languageSpecItem_AST->getFirstChild() : languageSpecItem_AST;
			currentAST.advanceChildToEnd();
			break;
		}
		case LITERAL_language:
		case LITERAL_languages:
		{
			{
			switch ( LA(1)) {
			case LITERAL_language:
			{
				Ilang = LT(1);
				Ilang_AST = astFactory.create(Ilang);
				match(LITERAL_language);
				break;
			}
			case LITERAL_languages:
			{
				Ilangs = LT(1);
				Ilangs_AST = astFactory.create(Ilangs);
				match(LITERAL_languages);
				break;
			}
			default:
			{
				throw NoViableAltException(LT(1));
			}
			}
			}
			E2 = LT(1);
			E2_AST = astFactory.create(E2);
			match(OP_EQ);
			languageCodeList();
			LL_AST = returnAST;
			languageSpecItem_AST = currentAST.root;
			languageSpecItem_AST = astFactory.make( (new ASTArray(4))->add(E2_AST)->add(Ilang_AST)->add(Ilangs_AST)->add(LL_AST));
			currentAST.root = languageSpecItem_AST;
			currentAST.child = languageSpecItem_AST!=nullAST &&languageSpecItem_AST->getFirstChild()!=nullAST ?
				languageSpecItem_AST->getFirstChild() : languageSpecItem_AST;
			currentAST.advanceChildToEnd();
			break;
		}
		default:
		{
			throw NoViableAltException(LT(1));
		}
		}
		}
		{
		if ((LA(1)==OP_SEMI) && (_tokenSet_45.member(LA(2))) && (_tokenSet_4.member(LA(3)))) {
			RefAST tmp171_AST = nullAST;
			tmp171_AST = astFactory.create(LT(1));
			match(OP_SEMI);
		}
		else if ((_tokenSet_45.member(LA(1))) && (_tokenSet_4.member(LA(2))) && (_tokenSet_4.member(LA(3)))) {
		}
		else {
			throw NoViableAltException(LT(1));
		}
		
		}
	}
	catch (ParserException& ex) {
		reportError(ex);
		consume();
		consumeUntil(_tokenSet_45);
	}
	returnAST = languageSpecItem_AST;
}